

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cShaderImageLoadStoreTests.cpp
# Opt level: O1

bool __thiscall
gl4cts::(anonymous_namespace)::LoadStoreMachine::Write<tcu::Vector<int,4>>
          (LoadStoreMachine *this,GLenum internalformat,Vector<int,_4> *write_value,
          Vector<int,_4> *expected_value)

{
  bool bVar1;
  undefined8 uVar2;
  _Alloc_hider _Var3;
  GLuint GVar4;
  GLint GVar5;
  uint uVar6;
  char *pcVar7;
  GLenum GVar8;
  GLenum e;
  GLenum e_00;
  GLenum e_01;
  Vector<int,_4> *v;
  Vector<int,_4> *v_00;
  Vector<int,_4> *extraout_RDX;
  Vector<int,_4> *v_01;
  Vector<int,_4> *extraout_RDX_00;
  Vector<int,_4> *extraout_RDX_01;
  Vector<int,_4> *extraout_RDX_02;
  Vector<int,_4> *extraout_RDX_03;
  Vector<int,_4> *pVVar9;
  Vector<float,_4> *v_02;
  long lVar10;
  CallLogWrapper *pCVar11;
  GLenum e_02;
  LoadStoreMachine *this_00;
  void *pvVar12;
  Vector<int,_4> *in_R8;
  _Alloc_hider _Var13;
  GLsizei GVar14;
  long lVar15;
  string *psVar16;
  int i_1;
  GLenum GVar17;
  GLenum *pGVar18;
  bool bVar19;
  int i;
  ulong uVar20;
  GLuint local_220;
  GLuint local_21c;
  GLuint texture_result;
  string local_208;
  GLuint textures [8];
  vec4 color;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1a8;
  void *local_190;
  Vector<int,_4> data;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_178;
  CallLogWrapper *local_160;
  string source;
  undefined8 local_88;
  undefined8 uStack_80;
  pointer local_78;
  size_type sStack_70;
  undefined8 local_68;
  undefined8 uStack_60;
  int local_58 [2];
  int aiStack_50 [2];
  float local_48 [2];
  float afStack_40 [4];
  
  this_00 = (LoadStoreMachine *)(ulong)*(uint *)(this + 0x2c);
  GVar8 = (GLenum)write_value;
  GVar17 = (GLenum)expected_value;
  switch(this_00) {
  case (LoadStoreMachine *)0x0:
    GenStoreShader<tcu::Vector<int,4>>(&source,this_00,internalformat,GVar8,in_R8);
    pVVar9 = (Vector<int,_4> *)0x0;
    local_21c = gl4cts::anon_unknown_0::ShaderImageLoadStoreBase::BuildProgram
                          ((ShaderImageLoadStoreBase *)this,source._M_dataplus._M_p,(char *)0x0,
                           (char *)0x0,(char *)0x0,(char *)0x0,(bool *)0x0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)source._M_dataplus._M_p != &source.field_2) {
      operator_delete(source._M_dataplus._M_p,source.field_2._M_allocated_capacity + 1);
    }
    GenLoadShader<tcu::Vector<int,4>>
              (&source,(LoadStoreMachine *)(ulong)*(uint *)(this + 0x2c),internalformat,GVar17,
               pVVar9);
    local_220 = gl4cts::anon_unknown_0::ShaderImageLoadStoreBase::BuildProgram
                          ((ShaderImageLoadStoreBase *)this,source._M_dataplus._M_p,(char *)0x0,
                           (char *)0x0,(char *)0x0,(char *)0x0,(bool *)0x0);
    break;
  case (LoadStoreMachine *)0x1:
    GenStoreShader<tcu::Vector<int,4>>(&source,this_00,internalformat,GVar8,in_R8);
    pVVar9 = (Vector<int,_4> *)0x0;
    local_21c = gl4cts::anon_unknown_0::ShaderImageLoadStoreBase::BuildProgram
                          ((ShaderImageLoadStoreBase *)this,"#version 420 core\nvoid main() {}",
                           source._M_dataplus._M_p,
                           "#version 420 core\nlayout(quads, point_mode) in;\nvoid main() {}",
                           (char *)0x0,(char *)0x0,(bool *)0x0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)source._M_dataplus._M_p != &source.field_2) {
      operator_delete(source._M_dataplus._M_p,source.field_2._M_allocated_capacity + 1);
    }
    GenLoadShader<tcu::Vector<int,4>>
              (&source,(LoadStoreMachine *)(ulong)*(uint *)(this + 0x2c),internalformat,GVar17,
               pVVar9);
    local_220 = gl4cts::anon_unknown_0::ShaderImageLoadStoreBase::BuildProgram
                          ((ShaderImageLoadStoreBase *)this,"#version 420 core\nvoid main() {}",
                           source._M_dataplus._M_p,
                           "#version 420 core\nlayout(quads, point_mode) in;\nvoid main() {}",
                           (char *)0x0,(char *)0x0,(bool *)0x0);
    break;
  case (LoadStoreMachine *)0x2:
    GenStoreShader<tcu::Vector<int,4>>(&source,this_00,internalformat,GVar8,in_R8);
    pVVar9 = (Vector<int,_4> *)0x0;
    local_21c = gl4cts::anon_unknown_0::ShaderImageLoadStoreBase::BuildProgram
                          ((ShaderImageLoadStoreBase *)this,"#version 420 core\nvoid main() {}",
                           (char *)0x0,source._M_dataplus._M_p,(char *)0x0,(char *)0x0,(bool *)0x0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)source._M_dataplus._M_p != &source.field_2) {
      operator_delete(source._M_dataplus._M_p,source.field_2._M_allocated_capacity + 1);
    }
    GenLoadShader<tcu::Vector<int,4>>
              (&source,(LoadStoreMachine *)(ulong)*(uint *)(this + 0x2c),internalformat,GVar17,
               pVVar9);
    local_220 = gl4cts::anon_unknown_0::ShaderImageLoadStoreBase::BuildProgram
                          ((ShaderImageLoadStoreBase *)this,"#version 420 core\nvoid main() {}",
                           (char *)0x0,source._M_dataplus._M_p,(char *)0x0,(char *)0x0,(bool *)0x0);
    break;
  case (LoadStoreMachine *)0x3:
    GenStoreShader<tcu::Vector<int,4>>(&source,this_00,internalformat,GVar8,in_R8);
    _Var13 = source._M_dataplus;
    local_21c = gl4cts::anon_unknown_0::ShaderImageLoadStoreBase::BuildProgram
                          ((ShaderImageLoadStoreBase *)this,"#version 420 core\nvoid main() {}",
                           (char *)0x0,(char *)0x0,source._M_dataplus._M_p,(char *)0x0,(bool *)0x0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)source._M_dataplus._M_p != &source.field_2) {
      operator_delete(source._M_dataplus._M_p,source.field_2._M_allocated_capacity + 1);
    }
    GenLoadShader<tcu::Vector<int,4>>
              (&source,(LoadStoreMachine *)(ulong)*(uint *)(this + 0x2c),internalformat,GVar17,
               (Vector<int,_4> *)_Var13._M_p);
    local_220 = gl4cts::anon_unknown_0::ShaderImageLoadStoreBase::BuildProgram
                          ((ShaderImageLoadStoreBase *)this,"#version 420 core\nvoid main() {}",
                           (char *)0x0,(char *)0x0,source._M_dataplus._M_p,(char *)0x0,(bool *)0x0);
    break;
  case (LoadStoreMachine *)0x4:
    GenStoreShader<tcu::Vector<int,4>>(&source,this_00,internalformat,GVar8,in_R8);
    textures._0_8_ = source._M_dataplus._M_p;
    pCVar11 = (CallLogWrapper *)(this + 8);
    GVar4 = glu::CallLogWrapper::glCreateShader(pCVar11,0x91b9);
    pVVar9 = (Vector<int,_4> *)0x0;
    glu::CallLogWrapper::glShaderSource(pCVar11,GVar4,1,(GLchar **)textures,(GLint *)0x0);
    glu::CallLogWrapper::glCompileShader(pCVar11,GVar4);
    local_21c = glu::CallLogWrapper::glCreateProgram(pCVar11);
    glu::CallLogWrapper::glAttachShader(pCVar11,local_21c,GVar4);
    glu::CallLogWrapper::glLinkProgram(pCVar11,local_21c);
    glu::CallLogWrapper::glDeleteShader(pCVar11,GVar4);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)source._M_dataplus._M_p != &source.field_2) {
      operator_delete(source._M_dataplus._M_p,source.field_2._M_allocated_capacity + 1);
    }
    GenLoadShader<tcu::Vector<int,4>>
              (&source,(LoadStoreMachine *)(ulong)*(uint *)(this + 0x2c),internalformat,GVar17,
               pVVar9);
    textures._0_8_ = source._M_dataplus._M_p;
    GVar4 = glu::CallLogWrapper::glCreateShader(pCVar11,0x91b9);
    glu::CallLogWrapper::glShaderSource(pCVar11,GVar4,1,(GLchar **)textures,(GLint *)0x0);
    glu::CallLogWrapper::glCompileShader(pCVar11,GVar4);
    local_220 = glu::CallLogWrapper::glCreateProgram(pCVar11);
    glu::CallLogWrapper::glAttachShader(pCVar11,local_220,GVar4);
    glu::CallLogWrapper::glLinkProgram(pCVar11,local_220);
    glu::CallLogWrapper::glDeleteShader(pCVar11,GVar4);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)source._M_dataplus._M_p == &source.field_2) goto LAB_009d0c96;
    goto LAB_009d0c74;
  default:
    local_220 = 0;
    local_21c = 0;
    goto LAB_009d0c96;
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)source._M_dataplus._M_p != &source.field_2) {
LAB_009d0c74:
    operator_delete(source._M_dataplus._M_p,source.field_2._M_allocated_capacity + 1);
  }
LAB_009d0c96:
  pCVar11 = (CallLogWrapper *)(this + 8);
  glu::CallLogWrapper::glGenTextures(pCVar11,8,textures);
  glu::CallLogWrapper::glGenTextures(pCVar11,1,&texture_result);
  glu::CallLogWrapper::glBindTexture(pCVar11,0xde1,texture_result);
  glu::CallLogWrapper::glTexParameteri(pCVar11,0xde1,0x2801,0x2600);
  glu::CallLogWrapper::glTexParameteri(pCVar11,0xde1,0x2800,0x2600);
  glu::CallLogWrapper::glTexStorage2D(pCVar11,0xde1,1,0x8814,1,1);
  pGVar18 = &DAT_01ac4d00;
  uVar20 = 0;
  do {
    GVar8 = *pGVar18;
    glu::CallLogWrapper::glBindTexture(pCVar11,GVar8,textures[uVar20]);
    glu::CallLogWrapper::glTexParameteri(pCVar11,GVar8,0x2801,0x2600);
    glu::CallLogWrapper::glTexParameteri(pCVar11,GVar8,0x2800,0x2600);
    switch(uVar20 & 0xffffffff) {
    case 0:
      glu::CallLogWrapper::glTexStorage1D(pCVar11,0xde0,1,internalformat,1);
      break;
    case 1:
    case 3:
      goto LAB_009d0e01;
    case 2:
    case 6:
      GVar14 = 2;
      goto LAB_009d0dee;
    case 4:
      GVar8 = 0x8513;
LAB_009d0e01:
      GVar14 = 1;
LAB_009d0e33:
      glu::CallLogWrapper::glTexStorage2D(pCVar11,GVar8,1,internalformat,1,GVar14);
      break;
    case 5:
      GVar8 = 0x8c18;
      GVar14 = 2;
      goto LAB_009d0e33;
    case 7:
      GVar8 = 0x9009;
      GVar14 = 0xc;
LAB_009d0dee:
      glu::CallLogWrapper::glTexStorage3D(pCVar11,GVar8,1,internalformat,1,1,GVar14);
    }
    uVar20 = uVar20 + 1;
    pGVar18 = pGVar18 + 1;
    if (uVar20 == 8) {
      glu::CallLogWrapper::glBindImageTexture(pCVar11,0,textures[0],0,'\0',0,0x88b9,internalformat);
      glu::CallLogWrapper::glBindImageTexture(pCVar11,1,textures[1],0,'\0',0,0x88b9,internalformat);
      glu::CallLogWrapper::glBindImageTexture
                (pCVar11,2,textures[2],0,'\x01',0,0x88b9,internalformat);
      glu::CallLogWrapper::glBindImageTexture(pCVar11,3,textures[3],0,'\0',0,0x88b9,internalformat);
      glu::CallLogWrapper::glBindImageTexture
                (pCVar11,4,textures[4],0,'\x01',0,0x88b9,internalformat);
      glu::CallLogWrapper::glBindImageTexture
                (pCVar11,5,textures[5],0,'\x01',0,0x88b9,internalformat);
      glu::CallLogWrapper::glBindImageTexture
                (pCVar11,6,textures[6],0,'\x01',0,0x88b9,internalformat);
      glu::CallLogWrapper::glBindImageTexture
                (pCVar11,7,textures[7],0,'\x01',0,0x88b9,internalformat);
      glu::CallLogWrapper::glUseProgram(pCVar11,local_21c);
      GVar5 = glu::CallLogWrapper::glGetUniformLocation(pCVar11,local_21c,"g_image_1d");
      glu::CallLogWrapper::glUniform1i(pCVar11,GVar5,0);
      GVar5 = glu::CallLogWrapper::glGetUniformLocation(pCVar11,local_21c,"g_image_2d");
      glu::CallLogWrapper::glUniform1i(pCVar11,GVar5,1);
      GVar5 = glu::CallLogWrapper::glGetUniformLocation(pCVar11,local_21c,"g_image_3d");
      glu::CallLogWrapper::glUniform1i(pCVar11,GVar5,2);
      GVar5 = glu::CallLogWrapper::glGetUniformLocation(pCVar11,local_21c,"g_image_2drect");
      glu::CallLogWrapper::glUniform1i(pCVar11,GVar5,3);
      GVar5 = glu::CallLogWrapper::glGetUniformLocation(pCVar11,local_21c,"g_image_cube");
      glu::CallLogWrapper::glUniform1i(pCVar11,GVar5,4);
      GVar5 = glu::CallLogWrapper::glGetUniformLocation(pCVar11,local_21c,"g_image_1darray");
      glu::CallLogWrapper::glUniform1i(pCVar11,GVar5,5);
      GVar5 = glu::CallLogWrapper::glGetUniformLocation(pCVar11,local_21c,"g_image_2darray");
      glu::CallLogWrapper::glUniform1i(pCVar11,GVar5,6);
      GVar5 = glu::CallLogWrapper::glGetUniformLocation(pCVar11,local_21c,"g_image_cube_array");
      glu::CallLogWrapper::glUniform1i(pCVar11,GVar5,7);
      glu::CallLogWrapper::glBindVertexArray(pCVar11,*(GLuint *)(this + 0x28));
      if (*(int *)(this + 0x2c) - 1U < 2) {
        glu::CallLogWrapper::glPatchParameteri(pCVar11,0x8e72,1);
        glu::CallLogWrapper::glDrawArrays(pCVar11,0xe,0,1);
        glu::CallLogWrapper::glPatchParameteri(pCVar11,0x8e72,3);
      }
      else if (*(int *)(this + 0x2c) == 4) {
        glu::CallLogWrapper::glDispatchCompute(pCVar11,1,1,1);
      }
      else {
        glu::CallLogWrapper::glDrawArrays(pCVar11,0,0,1);
      }
      bVar19 = true;
      lVar15 = 0;
      local_160 = pCVar11;
      local_190 = (void *)(ulong)internalformat;
      do {
        GVar8 = (&DAT_01ac4d00)[lVar15];
        glu::CallLogWrapper::glBindTexture(pCVar11,GVar8,textures[lVar15]);
        glu::CallLogWrapper::glMemoryBarrier(pCVar11,0x100);
        pvVar12 = local_190;
        if (lVar15 == 4) {
          GVar17 = 0x8515;
          do {
            data.m_data[0] = 0;
            data.m_data[1] = 0;
            data.m_data[2] = 0;
            data.m_data[3] = 0;
            glu::CallLogWrapper::glGetTexImage(pCVar11,GVar17,0,0x8d99,0x1404,&data);
            if (((data.m_data[0] != expected_value->m_data[0]) ||
                (data.m_data[1] != expected_value->m_data[1])) ||
               ((data.m_data[2] != expected_value->m_data[2] ||
                (data.m_data[3] != expected_value->m_data[3])))) {
              local_58[0] = data.m_data[0];
              local_58[1] = data.m_data[1];
              aiStack_50[0] = data.m_data[2];
              aiStack_50[1] = data.m_data[3];
              ShaderImageLoadStoreBase::ToString<tcu::Vector<int,4>>(&source,local_58,v);
              _Var3 = source._M_dataplus;
              local_68 = *(undefined8 *)expected_value->m_data;
              uStack_60 = *(undefined8 *)(expected_value->m_data + 2);
              ShaderImageLoadStoreBase::ToString<tcu::Vector<int,4>>(&local_208,&local_68,v_00);
              _Var13._M_p = local_208._M_dataplus._M_p;
              e_02 = (GLenum)pvVar12;
              ShaderImageLoadStoreBase::FormatEnumToString_abi_cxx11_
                        ((string *)&color,(void *)((ulong)pvVar12 & 0xffffffff),e);
              gl4cts::anon_unknown_0::ShaderImageLoadStoreBase::EnumToString
                        ((ShaderImageLoadStoreBase *)(ulong)GVar8,e_02);
              gl4cts::anon_unknown_0::ShaderImageLoadStoreBase::StageName
                        ((ShaderImageLoadStoreBase *)(ulong)*(uint *)(this + 0x2c),e_02);
              gl4cts::anon_unknown_0::Output
                        ("Value is: %s. Value should be: %s. Format is: %s. Target is: %s. Stage is: %s.\n"
                         ,_Var3._M_p,_Var13._M_p);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)color.m_data._0_8_ != &local_1a8) {
                operator_delete((void *)color.m_data._0_8_,local_1a8._M_allocated_capacity + 1);
              }
              pCVar11 = local_160;
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_208._M_dataplus._M_p != &local_208.field_2) {
                operator_delete(local_208._M_dataplus._M_p,
                                local_208.field_2._M_allocated_capacity + 1);
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)source._M_dataplus._M_p != &source.field_2) {
                operator_delete(source._M_dataplus._M_p,source.field_2._M_allocated_capacity + 1);
              }
              bVar19 = false;
            }
            GVar17 = GVar17 + 1;
          } while (GVar17 != 0x851b);
        }
        else {
          memset(&source,0,0xc0);
          memset(&source,0,0xc0);
          glu::CallLogWrapper::glGetTexImage(pCVar11,GVar8,0,0x8d99,0x1404,&source);
          uVar6 = (int)lVar15 - 2;
          lVar10 = 1;
          if (uVar6 < 6) {
            lVar10 = *(long *)(&DAT_01ab4c88 + (ulong)uVar6 * 8);
          }
          psVar16 = &source;
          pVVar9 = extraout_RDX;
          do {
            if ((((*(int *)&(psVar16->_M_dataplus)._M_p != expected_value->m_data[0]) ||
                 (*(int *)((long)&(psVar16->_M_dataplus)._M_p + 4) != expected_value->m_data[1])) ||
                ((int)psVar16->_M_string_length != expected_value->m_data[2])) ||
               (*(int *)((long)&psVar16->_M_string_length + 4) != expected_value->m_data[3])) {
              local_78 = (psVar16->_M_dataplus)._M_p;
              sStack_70 = psVar16->_M_string_length;
              ShaderImageLoadStoreBase::ToString<tcu::Vector<int,4>>(&local_208,&local_78,pVVar9);
              _Var13._M_p = local_208._M_dataplus._M_p;
              local_88 = *(undefined8 *)expected_value->m_data;
              uStack_80 = *(undefined8 *)(expected_value->m_data + 2);
              ShaderImageLoadStoreBase::ToString<tcu::Vector<int,4>>
                        ((string *)&color,&local_88,v_01);
              uVar2 = color.m_data._0_8_;
              pvVar12 = local_190;
              ShaderImageLoadStoreBase::FormatEnumToString_abi_cxx11_
                        ((string *)&data,local_190,e_00);
              GVar17 = (GLenum)pvVar12;
              gl4cts::anon_unknown_0::ShaderImageLoadStoreBase::EnumToString
                        ((ShaderImageLoadStoreBase *)(ulong)GVar8,GVar17);
              gl4cts::anon_unknown_0::ShaderImageLoadStoreBase::StageName
                        ((ShaderImageLoadStoreBase *)(ulong)*(uint *)(this + 0x2c),GVar17);
              gl4cts::anon_unknown_0::Output
                        ("Value is: %s. Value should be: %s. Format is: %s. Target is: %s. Stage is: %s.\n"
                         ,_Var13._M_p,uVar2);
              pVVar9 = extraout_RDX_00;
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)data.m_data._0_8_ != &local_178) {
                operator_delete((void *)data.m_data._0_8_,local_178._M_allocated_capacity + 1);
                pVVar9 = extraout_RDX_01;
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)color.m_data._0_8_ != &local_1a8) {
                operator_delete((void *)color.m_data._0_8_,local_1a8._M_allocated_capacity + 1);
                pVVar9 = extraout_RDX_02;
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_208._M_dataplus._M_p != &local_208.field_2) {
                operator_delete(local_208._M_dataplus._M_p,
                                local_208.field_2._M_allocated_capacity + 1);
                pVVar9 = extraout_RDX_03;
              }
              bVar19 = false;
            }
            psVar16 = (string *)&psVar16->field_2;
            lVar10 = lVar10 + -1;
            pCVar11 = local_160;
            pvVar12 = local_190;
          } while (lVar10 != 0);
        }
        lVar15 = lVar15 + 1;
      } while (lVar15 != 8);
      glu::CallLogWrapper::glBindImageTexture(pCVar11,0,texture_result,0,'\0',0,0x88b9,0x8814);
      GVar8 = (GLenum)pvVar12;
      glu::CallLogWrapper::glBindImageTexture(pCVar11,1,textures[1],0,'\0',0,35000,GVar8);
      glu::CallLogWrapper::glBindImageTexture(pCVar11,2,textures[2],0,'\x01',0,35000,GVar8);
      glu::CallLogWrapper::glBindImageTexture(pCVar11,3,textures[3],0,'\0',0,35000,GVar8);
      glu::CallLogWrapper::glBindImageTexture(pCVar11,4,textures[4],0,'\x01',0,35000,GVar8);
      glu::CallLogWrapper::glBindImageTexture(pCVar11,5,textures[5],0,'\x01',0,35000,GVar8);
      glu::CallLogWrapper::glBindImageTexture(pCVar11,6,textures[6],0,'\x01',0,35000,GVar8);
      glu::CallLogWrapper::glBindImageTexture(pCVar11,7,textures[7],0,'\x01',0,35000,GVar8);
      glu::CallLogWrapper::glUseProgram(pCVar11,local_220);
      GVar5 = glu::CallLogWrapper::glGetUniformLocation(pCVar11,local_220,"g_image_result");
      glu::CallLogWrapper::glUniform1i(pCVar11,GVar5,0);
      GVar5 = glu::CallLogWrapper::glGetUniformLocation(pCVar11,local_220,"g_image_2d");
      glu::CallLogWrapper::glUniform1i(pCVar11,GVar5,1);
      GVar5 = glu::CallLogWrapper::glGetUniformLocation(pCVar11,local_220,"g_image_3d");
      glu::CallLogWrapper::glUniform1i(pCVar11,GVar5,2);
      GVar5 = glu::CallLogWrapper::glGetUniformLocation(pCVar11,local_220,"g_image_2drect");
      glu::CallLogWrapper::glUniform1i(pCVar11,GVar5,3);
      GVar5 = glu::CallLogWrapper::glGetUniformLocation(pCVar11,local_220,"g_image_cube");
      glu::CallLogWrapper::glUniform1i(pCVar11,GVar5,4);
      GVar5 = glu::CallLogWrapper::glGetUniformLocation(pCVar11,local_220,"g_image_1darray");
      glu::CallLogWrapper::glUniform1i(pCVar11,GVar5,5);
      GVar5 = glu::CallLogWrapper::glGetUniformLocation(pCVar11,local_220,"g_image_2darray");
      glu::CallLogWrapper::glUniform1i(pCVar11,GVar5,6);
      GVar5 = glu::CallLogWrapper::glGetUniformLocation(pCVar11,local_220,"g_image_cube_array");
      glu::CallLogWrapper::glUniform1i(pCVar11,GVar5,7);
      if (*(int *)(this + 0x2c) - 1U < 2) {
        glu::CallLogWrapper::glPatchParameteri(pCVar11,0x8e72,1);
        glu::CallLogWrapper::glDrawArrays(pCVar11,0xe,0,1);
        glu::CallLogWrapper::glPatchParameteri(pCVar11,0x8e72,3);
      }
      else if (*(int *)(this + 0x2c) == 4) {
        glu::CallLogWrapper::glDispatchCompute(pCVar11,1,1,1);
      }
      else {
        glu::CallLogWrapper::glDrawArrays(pCVar11,0,0,1);
      }
      color.m_data[0] = 0.0;
      color.m_data[1] = 0.0;
      color.m_data[2] = 0.0;
      color.m_data[3] = 0.0;
      glu::CallLogWrapper::glBindTexture(pCVar11,0xde1,texture_result);
      glu::CallLogWrapper::glMemoryBarrier(pCVar11,0x100);
      lVar15 = 0;
      glu::CallLogWrapper::glGetTexImage(pCVar11,0xde1,0,0x1908,0x1406,&color);
      source._M_dataplus._M_p = (pointer)0x3f80000000000000;
      source._M_string_length = 0x3f80000000000000;
      bVar1 = true;
      do {
        if (bVar1) {
          bVar1 = *(float *)((long)&source._M_dataplus._M_p + lVar15 * 4) == color.m_data[lVar15];
        }
        else {
          bVar1 = false;
        }
        lVar15 = lVar15 + 1;
      } while (lVar15 != 4);
      if (!bVar1) {
        local_48[0] = color.m_data[0];
        local_48[1] = color.m_data[1];
        afStack_40[0] = color.m_data[2];
        afStack_40[1] = color.m_data[3];
        ShaderImageLoadStoreBase::ToString<tcu::Vector<float,4>>(&source,local_48,v_02);
        _Var3 = source._M_dataplus;
        ShaderImageLoadStoreBase::FormatEnumToString_abi_cxx11_
                  (&local_208,(void *)((ulong)pvVar12 & 0xffffffff),e_01);
        _Var13._M_p = local_208._M_dataplus._M_p;
        pcVar7 = gl4cts::anon_unknown_0::ShaderImageLoadStoreBase::StageName
                           ((ShaderImageLoadStoreBase *)(ulong)*(uint *)(this + 0x2c),GVar8);
        gl4cts::anon_unknown_0::Output
                  ("Color is: %s. Format is: %s. Stage is: %s.\n",_Var3._M_p,_Var13._M_p,pcVar7);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_208._M_dataplus._M_p != &local_208.field_2) {
          operator_delete(local_208._M_dataplus._M_p,local_208.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)source._M_dataplus._M_p != &source.field_2) {
          operator_delete(source._M_dataplus._M_p,source.field_2._M_allocated_capacity + 1);
        }
        bVar19 = false;
      }
      glu::CallLogWrapper::glUseProgram(pCVar11,0);
      glu::CallLogWrapper::glDeleteProgram(pCVar11,local_21c);
      glu::CallLogWrapper::glDeleteProgram(pCVar11,local_220);
      glu::CallLogWrapper::glDeleteTextures(pCVar11,8,textures);
      glu::CallLogWrapper::glDeleteTextures(pCVar11,1,&texture_result);
      return bVar19;
    }
  } while( true );
}

Assistant:

bool Write(GLenum internalformat, const T& write_value, const T& expected_value)
	{
		const GLenum targets[] = { GL_TEXTURE_1D,		GL_TEXTURE_2D,
								   GL_TEXTURE_3D,		GL_TEXTURE_RECTANGLE,
								   GL_TEXTURE_CUBE_MAP, GL_TEXTURE_1D_ARRAY,
								   GL_TEXTURE_2D_ARRAY, GL_TEXTURE_CUBE_MAP_ARRAY };
		const int kTargets		= sizeof(targets) / sizeof(targets[0]);
		GLuint	program_store = 0;
		GLuint	program_load  = 0;
		if (m_stage == 0)
		{ // VS
			program_store =
				BuildProgram(GenStoreShader(m_stage, internalformat, write_value).c_str(), NULL, NULL, NULL, NULL);
			program_load =
				BuildProgram(GenLoadShader(m_stage, internalformat, expected_value).c_str(), NULL, NULL, NULL, NULL);
		}
		else if (m_stage == 1)
		{ // TCS
			const char* const glsl_vs  = "#version 420 core" NL "void main() {}";
			const char* const glsl_tes = "#version 420 core" NL "layout(quads, point_mode) in;" NL "void main() {}";
			program_store = BuildProgram(glsl_vs, GenStoreShader(m_stage, internalformat, write_value).c_str(),
										 glsl_tes, NULL, NULL);
			program_load = BuildProgram(glsl_vs, GenLoadShader(m_stage, internalformat, expected_value).c_str(),
										glsl_tes, NULL, NULL);
		}
		else if (m_stage == 2)
		{ // TES
			const char* const glsl_vs = "#version 420 core" NL "void main() {}";
			program_store =
				BuildProgram(glsl_vs, NULL, GenStoreShader(m_stage, internalformat, write_value).c_str(), NULL, NULL);
			program_load =
				BuildProgram(glsl_vs, NULL, GenLoadShader(m_stage, internalformat, expected_value).c_str(), NULL, NULL);
		}
		else if (m_stage == 3)
		{ // GS
			const char* const glsl_vs = "#version 420 core" NL "void main() {}";
			program_store =
				BuildProgram(glsl_vs, NULL, NULL, GenStoreShader(m_stage, internalformat, write_value).c_str(), NULL);
			program_load =
				BuildProgram(glsl_vs, NULL, NULL, GenLoadShader(m_stage, internalformat, expected_value).c_str(), NULL);
		}
		else if (m_stage == 4)
		{ // CS
			{
				std::string		  source = GenStoreShader(m_stage, internalformat, write_value);
				const char* const src	= source.c_str();
				GLuint			  sh	 = glCreateShader(GL_COMPUTE_SHADER);
				glShaderSource(sh, 1, &src, NULL);
				glCompileShader(sh);
				program_store = glCreateProgram();
				glAttachShader(program_store, sh);
				glLinkProgram(program_store);
				glDeleteShader(sh);
			}
			{
				std::string		  source = GenLoadShader(m_stage, internalformat, expected_value);
				const char* const src	= source.c_str();
				GLuint			  sh	 = glCreateShader(GL_COMPUTE_SHADER);
				glShaderSource(sh, 1, &src, NULL);
				glCompileShader(sh);
				program_load = glCreateProgram();
				glAttachShader(program_load, sh);
				glLinkProgram(program_load);
				glDeleteShader(sh);
			}
		}
		GLuint textures[kTargets], texture_result;
		glGenTextures(kTargets, textures);
		glGenTextures(1, &texture_result);

		glBindTexture(GL_TEXTURE_2D, texture_result);
		glTexParameteri(GL_TEXTURE_2D, GL_TEXTURE_MIN_FILTER, GL_NEAREST);
		glTexParameteri(GL_TEXTURE_2D, GL_TEXTURE_MAG_FILTER, GL_NEAREST);
		glTexStorage2D(GL_TEXTURE_2D, 1, GL_RGBA32F, 1, 1);

		for (int i = 0; i < kTargets; ++i)
		{
			glBindTexture(targets[i], textures[i]);
			glTexParameteri(targets[i], GL_TEXTURE_MIN_FILTER, GL_NEAREST);
			glTexParameteri(targets[i], GL_TEXTURE_MAG_FILTER, GL_NEAREST);

			if (targets[i] == GL_TEXTURE_1D)
			{
				glTexStorage1D(targets[i], 1, internalformat, 1);
			}
			else if (targets[i] == GL_TEXTURE_2D || targets[i] == GL_TEXTURE_RECTANGLE)
			{
				glTexStorage2D(targets[i], 1, internalformat, 1, 1);
			}
			else if (targets[i] == GL_TEXTURE_3D || targets[i] == GL_TEXTURE_2D_ARRAY)
			{
				glTexStorage3D(targets[i], 1, internalformat, 1, 1, 2);
			}
			else if (targets[i] == GL_TEXTURE_CUBE_MAP)
			{
				glTexStorage2D(targets[i], 1, internalformat, 1, 1);
			}
			else if (targets[i] == GL_TEXTURE_CUBE_MAP_ARRAY)
			{
				glTexStorage3D(targets[i], 1, internalformat, 1, 1, 12);
			}
			else if (targets[i] == GL_TEXTURE_1D_ARRAY)
			{
				glTexStorage2D(targets[i], 1, internalformat, 1, 2);
			}
		}
		glBindImageTexture(0, textures[0], 0, GL_FALSE, 0, GL_WRITE_ONLY, internalformat);
		glBindImageTexture(1, textures[1], 0, GL_FALSE, 0, GL_WRITE_ONLY, internalformat);
		glBindImageTexture(2, textures[2], 0, GL_TRUE, 0, GL_WRITE_ONLY, internalformat);
		glBindImageTexture(3, textures[3], 0, GL_FALSE, 0, GL_WRITE_ONLY, internalformat);
		glBindImageTexture(4, textures[4], 0, GL_TRUE, 0, GL_WRITE_ONLY, internalformat);
		glBindImageTexture(5, textures[5], 0, GL_TRUE, 0, GL_WRITE_ONLY, internalformat);
		glBindImageTexture(6, textures[6], 0, GL_TRUE, 0, GL_WRITE_ONLY, internalformat);
		glBindImageTexture(7, textures[7], 0, GL_TRUE, 0, GL_WRITE_ONLY, internalformat);

		glUseProgram(program_store);
		glUniform1i(glGetUniformLocation(program_store, "g_image_1d"), 0);
		glUniform1i(glGetUniformLocation(program_store, "g_image_2d"), 1);
		glUniform1i(glGetUniformLocation(program_store, "g_image_3d"), 2);
		glUniform1i(glGetUniformLocation(program_store, "g_image_2drect"), 3);
		glUniform1i(glGetUniformLocation(program_store, "g_image_cube"), 4);
		glUniform1i(glGetUniformLocation(program_store, "g_image_1darray"), 5);
		glUniform1i(glGetUniformLocation(program_store, "g_image_2darray"), 6);
		glUniform1i(glGetUniformLocation(program_store, "g_image_cube_array"), 7);

		glBindVertexArray(m_vao);
		if (m_stage == 1 || m_stage == 2)
		{ // TCS or TES
			glPatchParameteri(GL_PATCH_VERTICES, 1);
			glDrawArrays(GL_PATCHES, 0, 1);
			glPatchParameteri(GL_PATCH_VERTICES, 3);
		}
		else if (m_stage == 4)
		{ // CS
			glDispatchCompute(1, 1, 1);
		}
		else
		{
			glDrawArrays(GL_POINTS, 0, 1);
		}

		bool status = true;
		for (int i = 0; i < kTargets; ++i)
		{
			glBindTexture(targets[i], textures[i]);
			glMemoryBarrier(GL_TEXTURE_UPDATE_BARRIER_BIT);

			if (targets[i] == GL_TEXTURE_CUBE_MAP)
			{
				for (int face = 0; face < 6; ++face)
				{
					T data;
					glGetTexImage(GL_TEXTURE_CUBE_MAP_POSITIVE_X + face, 0, Format<T>(), Type<T>(), &data[0]);
					if (!Equal(data, expected_value, internalformat))
					{
						status = false;
						Output("Value is: %s. Value should be: %s. Format is: %s. Target is: %s. Stage is: %s.\n",
							   ToString(data).c_str(), ToString(expected_value).c_str(),
							   FormatEnumToString(internalformat).c_str(), EnumToString(targets[i]),
							   StageName(m_stage));
					}
				}
			}
			else
			{
				T data[12];
				memset(&data[0], 0, sizeof(data));
				glGetTexImage(targets[i], 0, Format<T>(), Type<T>(), &data[0]);

				int count = 1;
				if (targets[i] == GL_TEXTURE_3D || targets[i] == GL_TEXTURE_2D_ARRAY)
					count = 2;
				else if (targets[i] == GL_TEXTURE_CUBE_MAP_ARRAY)
					count = 12;
				else if (targets[i] == GL_TEXTURE_1D_ARRAY)
					count = 2;

				for (int j = 0; j < count; ++j)
				{
					if (!Equal(data[j], expected_value, internalformat))
					{
						status = false;
						Output("Value is: %s. Value should be: %s. Format is: %s. Target is: %s. Stage is: %s.\n",
							   ToString(data[j]).c_str(), ToString(expected_value).c_str(),
							   FormatEnumToString(internalformat).c_str(), EnumToString(targets[i]),
							   StageName(m_stage));
					}
				}
			}
		}
		glBindImageTexture(0, texture_result, 0, GL_FALSE, 0, GL_WRITE_ONLY, GL_RGBA32F);
		glBindImageTexture(1, textures[1], 0, GL_FALSE, 0, GL_READ_ONLY, internalformat);
		glBindImageTexture(2, textures[2], 0, GL_TRUE, 0, GL_READ_ONLY, internalformat);
		glBindImageTexture(3, textures[3], 0, GL_FALSE, 0, GL_READ_ONLY, internalformat);
		glBindImageTexture(4, textures[4], 0, GL_TRUE, 0, GL_READ_ONLY, internalformat);
		glBindImageTexture(5, textures[5], 0, GL_TRUE, 0, GL_READ_ONLY, internalformat);
		glBindImageTexture(6, textures[6], 0, GL_TRUE, 0, GL_READ_ONLY, internalformat);
		glBindImageTexture(7, textures[7], 0, GL_TRUE, 0, GL_READ_ONLY, internalformat);

		glUseProgram(program_load);
		glUniform1i(glGetUniformLocation(program_load, "g_image_result"), 0);
		glUniform1i(glGetUniformLocation(program_load, "g_image_2d"), 1);
		glUniform1i(glGetUniformLocation(program_load, "g_image_3d"), 2);
		glUniform1i(glGetUniformLocation(program_load, "g_image_2drect"), 3);
		glUniform1i(glGetUniformLocation(program_load, "g_image_cube"), 4);
		glUniform1i(glGetUniformLocation(program_load, "g_image_1darray"), 5);
		glUniform1i(glGetUniformLocation(program_load, "g_image_2darray"), 6);
		glUniform1i(glGetUniformLocation(program_load, "g_image_cube_array"), 7);

		if (m_stage == 1 || m_stage == 2)
		{ // TCS or TES
			glPatchParameteri(GL_PATCH_VERTICES, 1);
			glDrawArrays(GL_PATCHES, 0, 1);
			glPatchParameteri(GL_PATCH_VERTICES, 3);
		}
		else if (m_stage == 4)
		{ // CS
			glDispatchCompute(1, 1, 1);
		}
		else
		{
			glDrawArrays(GL_POINTS, 0, 1);
		}
		{
			vec4 color;
			glBindTexture(GL_TEXTURE_2D, texture_result);
			glMemoryBarrier(GL_TEXTURE_UPDATE_BARRIER_BIT);
			glGetTexImage(GL_TEXTURE_2D, 0, GL_RGBA, GL_FLOAT, &color[0]);
			if (!tcu::allEqual(color, vec4(0, 1, 0, 1)))
			{
				status = false;
				Output("Color is: %s. Format is: %s. Stage is: %s.\n", ToString(color).c_str(),
					   FormatEnumToString(internalformat).c_str(), StageName(m_stage));
			}
		}
		glUseProgram(0);
		glDeleteProgram(program_store);
		glDeleteProgram(program_load);
		glDeleteTextures(kTargets, textures);
		glDeleteTextures(1, &texture_result);
		return status;
	}